

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::SetCurrentLinkType(cmComputeLinkInformation *this,LinkType lt)

{
  Item local_40;
  
  if ((this->CurrentLinkType != lt) && (this->CurrentLinkType = lt, this->LinkTypeEnabled == true))
  {
    if (lt == LinkShared) {
      std::__cxx11::string::string((string *)&local_40,(string *)&this->SharedLinkTypeFlag);
      local_40.IsPath = false;
      local_40.Target = (cmGeneratorTarget *)0x0;
      std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
      emplace_back<cmComputeLinkInformation::Item>(&this->Items,&local_40);
    }
    else {
      if (lt != LinkStatic) {
        return;
      }
      std::__cxx11::string::string((string *)&local_40,(string *)&this->StaticLinkTypeFlag);
      local_40.IsPath = false;
      local_40.Target = (cmGeneratorTarget *)0x0;
      std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
      emplace_back<cmComputeLinkInformation::Item>(&this->Items,&local_40);
    }
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::SetCurrentLinkType(LinkType lt)
{
  // If we are changing the current link type add the flag to tell the
  // linker about it.
  if (this->CurrentLinkType != lt) {
    this->CurrentLinkType = lt;

    if (this->LinkTypeEnabled) {
      switch (this->CurrentLinkType) {
        case LinkStatic:
          this->Items.push_back(Item(this->StaticLinkTypeFlag, false));
          break;
        case LinkShared:
          this->Items.push_back(Item(this->SharedLinkTypeFlag, false));
          break;
        default:
          break;
      }
    }
  }
}